

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O1

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  pointer *this_00;
  Type *this_01;
  LocalGet *get;
  _Base_ptr p_Var1;
  size_t sVar2;
  long lVar3;
  LocalSet *pLVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *pvVar7;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar8;
  Expression *pEVar9;
  mapped_type *pppEVar10;
  LocalSet *this_02;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *pvVar11;
  Type TVar12;
  _Rb_tree_const_iterator<wasm::LocalSet_*> _Var13;
  _Base_ptr p_Var14;
  long *plVar15;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *pvVar16;
  Type in_R8;
  undefined1 local_e0 [8];
  Iterator __end3;
  FindAll<wasm::LocalGet> gets;
  Builder local_88;
  Builder builder;
  undefined1 local_70 [8];
  Iterator __begin3;
  LocalSet *local_40;
  Expression *value;
  
  builder.wasm = (Module *)graph;
  FindAll<wasm::LocalGet>::FindAll
            ((FindAll<wasm::LocalGet> *)&__end3.flexibleIterator,this->func->body);
  if (__end3.flexibleIterator._M_node !=
      (_Base_ptr)
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &((builder.wasm)->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar7 = &(builder.wasm)->tags;
    _Var13 = __end3.flexibleIterator;
    do {
      get = *(LocalGet **)_Var13._M_node;
      pSVar8 = &LocalGraph::getSets((LocalGraph *)builder.wasm,get)->
                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ;
      p_Var1 = (_Base_ptr)(pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      p_Var14 = p_Var1;
      if (p_Var1 == (_Base_ptr)0x0) {
        p_Var14 = (_Base_ptr)(pSVar8->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      if (p_Var14 != (_Base_ptr)0x0) {
        if (p_Var14 == (_Base_ptr)0x1) {
          p_Var14 = p_Var1;
          if (p_Var1 != (_Base_ptr)0x0) {
            p_Var14 = (pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          p_Var14 = p_Var14 + 1;
          if (p_Var1 == (_Base_ptr)0x0) {
            p_Var14 = (_Base_ptr)
                      &(pSVar8->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
          }
          if (*(uintptr_t *)&p_Var14->_M_color == 0) {
            bVar6 = Function::isParam(this->func,get->index);
            if (!bVar6) {
              local_70 = (undefined1  [8])
                         (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                         type.id;
              bVar6 = wasm::Type::isDefaultable((Type *)local_70);
              if (bVar6) {
                this_01 = &(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression
                           .type;
                pEVar9 = LiteralUtils::makeZero((Type)this_01->id,this->module);
                local_70 = (undefined1  [8])get;
                pppEVar10 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)local_70);
                **pppEVar10 = pEVar9;
                bVar6 = wasm::Type::hasPredicate<&(wasm::Type::isRef()const)>(this_01);
                if (bVar6) {
                  this->refinalize = true;
                }
              }
            }
          }
          else {
            get->index = *(Index *)(*(uintptr_t *)&p_Var14->_M_color + 0x10);
          }
        }
        else if (this->allowMerges == true) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                         type.id;
          __begin3.flexibleIterator._M_node._4_4_ =
               Builder::addVar((Builder *)this->func,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
          value._4_4_ = get->index;
          get->index = __begin3.flexibleIterator._M_node._4_4_;
          local_88.wasm = this->module;
          sVar2 = (pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          __end3.parent._0_1_ = sVar2 == 0;
          __begin3.fixedIndex = 0;
          if ((bool)__end3.parent._0_1_) {
            __begin3.usingFixed = false;
            __begin3._9_7_ = 0;
          }
          else {
            __begin3.fixedIndex =
                 (size_t)(pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          __end3.fixedIndex = 0;
          local_e0 = (undefined1  [8])pSVar8;
          local_70 = (undefined1  [8])pSVar8;
          __begin3.parent._0_1_ = __end3.parent._0_1_;
          if (sVar2 == 0) {
            __end3._8_8_ = (pSVar8->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
          }
          else {
            __end3.fixedIndex = (size_t)&(pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header;
          }
          while (bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ::
                         IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                         ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                       *)local_70,(Iterator *)local_e0), !bVar6) {
            plVar15 = (long *)(__begin3.fixedIndex + 0x20);
            if ((char)__begin3.parent != '\0') {
              plVar15 = (long *)((long)local_70 + __begin3._8_8_ * 8 + 8);
            }
            lVar3 = *plVar15;
            if (lVar3 == 0) {
              bVar6 = Function::isParam(this->func,value._4_4_);
              if (bVar6) {
                TVar12 = Function::getLocalType(this->func,value._4_4_);
                pEVar9 = (Expression *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x18,8);
                pEVar9->_id = LocalGetId;
                *(Index *)(pEVar9 + 1) = value._4_4_;
                (pEVar9->type).id = TVar12.id;
                local_40 = Builder::makeLocalSet
                                     (&local_88,__begin3.flexibleIterator._M_node._4_4_,pEVar9);
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                           &this->functionPrepends,(Expression **)&local_40);
              }
            }
            else {
              pLVar4 = *(LocalSet **)(lVar3 + 0x18);
              TVar12.id = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                          type.id;
              local_40 = pLVar4;
              this_02 = (LocalSet *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x20,8);
              (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
                   LocalSetId;
              (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
                   = 0;
              this_02->index = __begin3.flexibleIterator._M_node._4_4_;
              this_02->value = (Expression *)pLVar4;
              LocalSet::makeTee(this_02,TVar12);
              *(mapped_type)(lVar3 + 0x18) = (Expression *)this_02;
              pvVar11 = pvVar7;
              for (pvVar16 = (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                              *)((builder.wasm)->tags).
                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  pvVar16 !=
                  (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   *)0x0; pvVar16 = (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                     *)(&(pvVar16->
                                         super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage)[bVar6]
                  ) {
                bVar6 = (LocalSet *)
                        (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                           *)(pvVar16 + 1))->
                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish < local_40;
                if (!bVar6) {
                  pvVar11 = pvVar16;
                }
              }
              pvVar16 = pvVar7;
              if ((pvVar11 != pvVar7) &&
                 (pvVar16 = pvVar11,
                 local_40 <
                 (LocalSet *)
                 (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                    *)(pvVar11 + 1))->
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish)) {
                pvVar16 = pvVar7;
              }
              if (pvVar16 != pvVar7) {
                pppEVar10 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)&local_40);
                if (*pppEVar10 != (mapped_type)(lVar3 + 0x18)) {
                  __assert_fail("graph.locations[value] == &set->value",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SSAify.cpp"
                                ,0xb6,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
                }
                pppEVar10 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)&local_40);
                *pppEVar10 = &this_02->value;
              }
            }
            if ((char)__begin3.parent == '\x01') {
              __begin3._8_8_ = __begin3._8_8_ + 1;
            }
            else {
              __begin3.fixedIndex =
                   std::_Rb_tree_increment((_Rb_tree_node_base *)__begin3.fixedIndex);
            }
          }
        }
      }
      _Var13._M_node = (_Base_ptr)&(_Var13._M_node)->_M_parent;
    } while (_Var13._M_node !=
             (_Base_ptr)
             gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (__end3.flexibleIterator._M_node != (_Base_ptr)0x0) {
    operator_delete(__end3.flexibleIterator._M_node,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)__end3.flexibleIterator._M_node);
  }
  return;
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSets(get);
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
            // If we replace a local.get with a null then we are refining the
            // type that the parent receives to a bottom type.
            if (get->type.hasRef()) {
              refinalize = true;
            }
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }